

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.c
# Opt level: O2

void mbedtls_pem_free(mbedtls_pem_context *ctx)

{
  uchar *__ptr;
  
  if (ctx->buf == (uchar *)0x0) {
    __ptr = (uchar *)0x0;
  }
  else {
    mbedtls_zeroize(ctx->buf,ctx->buflen);
    __ptr = ctx->buf;
  }
  free(__ptr);
  free(ctx->info);
  mbedtls_zeroize(ctx,0x18);
  return;
}

Assistant:

void mbedtls_pem_free( mbedtls_pem_context *ctx )
{
    if( ctx->buf != NULL )
        mbedtls_zeroize( ctx->buf, ctx->buflen );
    mbedtls_free( ctx->buf );
    mbedtls_free( ctx->info );

    mbedtls_zeroize( ctx, sizeof( mbedtls_pem_context ) );
}